

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

CharFieldSource * CharFieldSource::create(vm_val_t *val,vm_val_t *newval)

{
  int iVar1;
  CharFieldSource *pCVar2;
  CharFieldSourceString *this;
  size_t len;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  char *str;
  char *in_stack_ffffffffffffffc8;
  CharFieldSourceByteArray *in_stack_ffffffffffffffd0;
  vm_val_t *in_stack_fffffffffffffff8;
  
  vm_val_t::set_nil(in_RSI);
  if ((in_RDI->typ == VM_OBJ) && (iVar1 = CVmObjByteArray::is_byte_array(0), iVar1 != 0)) {
    pCVar2 = (CharFieldSource *)operator_new(0x20);
    CharFieldSourceByteArray::CharFieldSourceByteArray
              (in_stack_ffffffffffffffd0,(vm_obj_id_t)((ulong)pCVar2 >> 0x20));
    return pCVar2;
  }
  this = (CharFieldSourceString *)vm_val_t::cast_to_string(in_stack_fffffffffffffff8,in_RDI);
  pCVar2 = (CharFieldSource *)operator_new(0x18);
  len = vmb_get_len((char *)0x327992);
  CharFieldSourceString::CharFieldSourceString(this,in_stack_ffffffffffffffc8,len);
  return pCVar2;
}

Assistant:

CharFieldSource *CharFieldSource::create(
    VMG_ const vm_val_t *val, vm_val_t *newval)
{
    /* presume we won't create a new value */
    newval->set_nil();

    /* check to see if it's a ByteArray */
    if (val->typ == VM_OBJ
        && CVmObjByteArray::is_byte_array(vmg_ val->val.obj))
        return new CharFieldSourceByteArray(vmg_ val->val.obj);

    /* it's not another acceptable type, so it has to be a string */
    const char *str = val->cast_to_string(vmg_ newval);
    return new CharFieldSourceString(str + VMB_LEN, vmb_get_len(str));
}